

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int iVar1;
  seqStore_t *in_RCX;
  ulong srcSize_00;
  ZSTD_matchState_t *in_RDX;
  long in_RDI;
  U32 *in_R8;
  U32 mls;
  undefined4 in_stack_ffffffffffffffc8;
  size_t local_8;
  
  iVar1 = *(int *)(in_RDI + 0x110);
  if (*(long *)(in_RDI + 0xf8) == 0) {
    srcSize_00 = (ulong)(iVar1 - 4);
    switch(srcSize_00) {
    default:
      local_8 = ZSTD_compressBlock_fast_extDict_4_0
                          (in_RDX,in_RCX,in_R8,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                           srcSize_00);
      break;
    case 1:
      local_8 = ZSTD_compressBlock_fast_extDict_5_0
                          (in_RDX,in_RCX,in_R8,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                           srcSize_00);
      break;
    case 2:
      local_8 = ZSTD_compressBlock_fast_extDict_6_0
                          (in_RDX,in_RCX,in_R8,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                           srcSize_00);
      break;
    case 3:
      local_8 = ZSTD_compressBlock_fast_extDict_7_0
                          (in_RDX,in_RCX,in_R8,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                           srcSize_00);
    }
    return local_8;
  }
  __assert_fail("ms->dictMatchState == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x7365,
                "size_t ZSTD_compressBlock_fast_extDict(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
               );
}

Assistant:

size_t ZSTD_compressBlock_fast_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_extDict_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_extDict_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_extDict_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_extDict_7_0(ms, seqStore, rep, src, srcSize);
    }
}